

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v7::basic_memory_buffer<char,_500UL,_std::allocator<char>_>::grow
          (basic_memory_buffer<char,_500UL,_std::allocator<char>_> *this,size_t size)

{
  size_t sVar1;
  buffer<char> *pbVar2;
  pointer p;
  ulong in_RSI;
  buffer<char> *in_RDI;
  char *new_data;
  char *old_data;
  size_t new_capacity;
  size_t old_capacity;
  char *in_stack_ffffffffffffffa8;
  allocator_type *in_stack_ffffffffffffffb0;
  buffer<char> *this_00;
  buffer<char> *__last;
  char *__first;
  size_t local_20;
  
  sVar1 = detail::buffer<char>::capacity(in_RDI);
  local_20 = sVar1 + (sVar1 >> 1);
  if (local_20 < in_RSI) {
    local_20 = in_RSI;
  }
  pbVar2 = (buffer<char> *)detail::buffer<char>::data(in_RDI);
  p = std::allocator_traits<std::allocator<char>_>::allocate
                (in_stack_ffffffffffffffb0,(size_type)in_stack_ffffffffffffffa8);
  this_00 = pbVar2;
  __last = pbVar2;
  sVar1 = detail::buffer<char>::size(in_RDI);
  __first = (char *)((long)&this_00->_vptr_buffer + sVar1);
  detail::make_checked<char>(p,local_20);
  std::uninitialized_copy<char*,char*>(__first,(char *)__last,(char *)this_00);
  detail::buffer<char>::set(in_RDI,p,local_20);
  if (pbVar2 != in_RDI + 1) {
    __gnu_cxx::new_allocator<char>::deallocate
              ((new_allocator<char> *)this_00,in_stack_ffffffffffffffa8,0x25f698);
  }
  return;
}

Assistant:

void basic_memory_buffer<T, SIZE, Allocator>::grow(size_t size) {
#ifdef FMT_FUZZ
  if (size > 5000) throw std::runtime_error("fuzz mode - won't grow that much");
#endif
  size_t old_capacity = this->capacity();
  size_t new_capacity = old_capacity + old_capacity / 2;
  if (size > new_capacity) new_capacity = size;
  T* old_data = this->data();
  T* new_data =
      std::allocator_traits<Allocator>::allocate(alloc_, new_capacity);
  // The following code doesn't throw, so the raw pointer above doesn't leak.
  std::uninitialized_copy(old_data, old_data + this->size(),
                          detail::make_checked(new_data, new_capacity));
  this->set(new_data, new_capacity);
  // deallocate must not throw according to the standard, but even if it does,
  // the buffer already uses the new storage and will deallocate it in
  // destructor.
  if (old_data != store_) alloc_.deallocate(old_data, old_capacity);
}